

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O0

void Npn_ManResize(Npn_Man_t *p)

{
  int iVar1;
  int *__ptr;
  int iVar2;
  int iVar3;
  int *piVar4;
  Npn_Obj_t *local_60;
  Npn_Obj_t *local_50;
  abctime clk;
  int local_38;
  int i;
  int Counter;
  int nBinsOld;
  int *ppPlace;
  int *pBinsOld;
  Npn_Obj_t *pNext;
  Npn_Obj_t *pEntry;
  Npn_Man_t *p_local;
  
  if (p->pBins == (int *)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                  ,0x18d,"void Npn_ManResize(Npn_Man_t *)");
  }
  Abc_Clock();
  __ptr = p->pBins;
  iVar1 = p->nBins;
  iVar2 = Abc_PrimeCudd(iVar1 * 3);
  p->nBins = iVar2;
  piVar4 = (int *)calloc((long)p->nBins,4);
  p->pBins = piVar4;
  local_38 = 1;
  for (clk._4_4_ = 0; clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
    pNext = Npn_ManObj(p,__ptr[clk._4_4_]);
    if (pNext == (Npn_Obj_t *)0x0) {
      local_50 = (Npn_Obj_t *)0x0;
    }
    else {
      local_50 = Npn_ManObj(p,pNext->iNext);
    }
    pBinsOld = (int *)local_50;
    while (pNext != (Npn_Obj_t *)0x0) {
      piVar4 = p->pBins;
      iVar2 = Npn_ManHash(p,pNext->uTruth);
      pNext->iNext = piVar4[iVar2];
      iVar3 = Npn_ManObjNum(p,pNext);
      piVar4[iVar2] = iVar3;
      local_38 = local_38 + 1;
      pNext = (Npn_Obj_t *)pBinsOld;
      if (pBinsOld == (int *)0x0) {
        local_60 = (Npn_Obj_t *)0x0;
      }
      else {
        local_60 = Npn_ManObj(p,pBinsOld[3]);
      }
      pBinsOld = (int *)local_60;
    }
  }
  if (local_38 != p->nEntries) {
    __assert_fail("Counter == p->nEntries",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                  ,0x1a5,"void Npn_ManResize(Npn_Man_t *)");
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Npn_ManResize( Npn_Man_t * p )
{
    Npn_Obj_t * pEntry, * pNext;
    int * pBinsOld, * ppPlace;
    int nBinsOld, Counter, i;
    abctime clk;
    assert( p->pBins != NULL );
clk = Abc_Clock();
    // save the old Bins
    pBinsOld = p->pBins;
    nBinsOld = p->nBins;
    // get the new Bins
    p->nBins = Abc_PrimeCudd( 3 * nBinsOld ); 
    p->pBins = ABC_CALLOC( int, p->nBins );
    // rehash the entries from the old table
    Counter = 1;
    for ( i = 0; i < nBinsOld; i++ )
    for ( pEntry = Npn_ManObj(p, pBinsOld[i]), 
          pNext = pEntry ? Npn_ManObj(p, pEntry->iNext) : NULL; 
          pEntry; 
          pEntry = pNext, 
          pNext = pEntry ? Npn_ManObj(p, pEntry->iNext) : NULL )
    {
        // get the place where this entry goes 
        ppPlace = p->pBins + Npn_ManHash( p, pEntry->uTruth );
        // add the entry to the list
        pEntry->iNext = *ppPlace;
        *ppPlace = Npn_ManObjNum( p, pEntry );
        Counter++;
    }
    assert( Counter == p->nEntries );
    ABC_FREE( pBinsOld );
//ABC_PRT( "Hash table resizing time", Abc_Clock() - clk );
}